

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O1

void (anonymous_namespace)::permutations<Imath_2_5::Vec4<short>>
               (vector<Imath_2_5::Vec4<short>,_std::allocator<Imath_2_5::Vec4<short>_>_> *perms)

{
  int level;
  vector<int,_std::allocator<int>_> value;
  int local_34;
  vector<int,_std::allocator<int>_> local_30;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_30,4,(allocator_type *)&local_34);
  local_34 = -1;
  visit<Imath_2_5::Vec4<short>>(&local_34,4,0,&local_30,perms);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void
permutations(std::vector<T> &perms)
{
    std::vector<int> value(T::dimensions());
    int level = -1;
    int n     = T::dimensions();

    visit(level, n, 0, value, perms);
}